

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  long lVar1;
  int iVar2;
  Parse *pParse;
  Parse *pPVar3;
  Vdbe *pVVar4;
  Expr *pEVar5;
  Parse *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Window *pWin;
  CollSeq *pColl;
  CollSeq *pNat;
  sqlite3 *db;
  Expr *pCopy;
  int iColumn;
  Expr *pNew;
  Expr ifNullRow;
  u32 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  sqlite3 *in_stack_ffffffffffffff40;
  Expr *in_stack_ffffffffffffff48;
  char *pcVar6;
  sqlite3 *in_stack_ffffffffffffff50;
  Select *in_stack_ffffffffffffff58;
  SubstContext *in_stack_ffffffffffffff60;
  Window *pWVar7;
  Expr *in_stack_ffffffffffffff68;
  Parse *in_stack_ffffffffffffff70;
  Expr *in_stack_ffffffffffffff90;
  Parse *local_58;
  undefined1 local_50 [4];
  undefined4 local_4c;
  char *local_40;
  undefined4 local_24;
  undefined2 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (Parse *)0x0) {
    local_58 = (Parse *)0x0;
  }
  else {
    if ((((ulong)in_RSI->db & 0x300000000) != 0) &&
       (((anon_union_4_2_009eaf8f_for_w *)&in_RSI->nErr)->iJoin == *(int *)(in_RDI + 1))) {
      *(anon_union_4_2_009eaf8f_for_w *)&in_RSI->nErr =
           *(anon_union_4_2_009eaf8f_for_w *)((long)in_RDI + 0xc);
    }
    if (((*(u8 *)&in_RSI->db == 0xa8) && (in_RSI->nRangeReg == *(int *)(in_RDI + 1))) &&
       (((ulong)in_RSI->db & 0x2000000000) == 0)) {
      memset(local_50,0xaa,0x48);
      pcVar6 = *(char **)(in_RDI[3] + 8 + (long)(int)(short)in_RSI->iRangeReg * 0x18);
      iVar2 = sqlite3ExprIsVector((Expr *)0x1f2bf9);
      if (iVar2 == 0) {
        lVar1 = *(long *)*in_RDI;
        if ((*(int *)(in_RDI + 2) != 0) &&
           ((*pcVar6 != -0x58 || (*(int *)(pcVar6 + 0x2c) != *(int *)((long)in_RDI + 0xc))))) {
          memset(local_50,0,0x48);
          local_50[0] = 0xb3;
          local_24 = *(undefined4 *)((long)in_RDI + 0xc);
          local_20 = 0xff9d;
          local_4c = 0x40000;
          local_40 = pcVar6;
        }
        local_58 = (Parse *)sqlite3ExprDup(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                           (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        if (*(char *)(lVar1 + 0x67) == '\0') {
          if (*(int *)(in_RDI + 2) != 0) {
            *(u32 *)((long)&local_58->db + 4) = *(u32 *)((long)&local_58->db + 4) | 0x200000;
          }
          if (*(u8 *)&local_58->db == 0xab) {
            iVar2 = sqlite3ExprTruthValue((Expr *)0x1f2d13);
            ((anon_union_8_2_443a03b8_for_u *)&local_58->zErrMsg)->iValue = iVar2;
            *(u8 *)&local_58->db = 0x9c;
            *(u32 *)((long)&local_58->db + 4) = *(u32 *)((long)&local_58->db + 4) | 0x800;
          }
          pParse = (Parse *)sqlite3ExprCollSeq(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          pPVar3 = (Parse *)sqlite3ExprCollSeq(pParse,in_stack_ffffffffffffff68);
          if ((pParse != pPVar3) ||
             ((*(char *)&local_58->db != -0x58 && (*(char *)&local_58->db != 'r')))) {
            if (pPVar3 == (Parse *)0x0) {
              pcVar6 = "BINARY";
            }
            else {
              pcVar6 = (char *)pPVar3->db;
            }
            local_58 = (Parse *)sqlite3ExprAddCollateString(local_58,(Expr *)*in_RDI,pcVar6);
          }
          *(u32 *)((long)&local_58->db + 4) = *(u32 *)((long)&local_58->db + 4) & 0xfffffdff;
          if (((ulong)in_RSI->db & 0x300000000) != 0) {
            sqlite3SetJoinExpr((Expr *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                               in_stack_ffffffffffffff38);
          }
          sqlite3ExprDelete(in_stack_ffffffffffffff40,
                            (Expr *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        }
        else {
          sqlite3ExprDelete(in_stack_ffffffffffffff40,
                            (Expr *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_58 = in_RSI;
        }
      }
      else {
        sqlite3VectorErrorMsg
                  ((Parse *)in_stack_ffffffffffffff40,
                   (Expr *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_58 = in_RSI;
      }
    }
    else {
      if ((*(u8 *)&in_RSI->db == 0xb3) && (in_RSI->nRangeReg == *(int *)(in_RDI + 1))) {
        in_RSI->nRangeReg = *(int *)((long)in_RDI + 0xc);
      }
      pVVar4 = (Vdbe *)substExpr((SubstContext *)in_RSI,in_stack_ffffffffffffff90);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      in_RSI->pVdbe = pVVar4;
      pEVar5 = substExpr((SubstContext *)in_RSI,in_stack_ffffffffffffff90);
      *(Expr **)&in_RSI->rc = pEVar5;
      if (((ulong)in_RSI->db & 0x100000000000) == 0) {
        substExprList((SubstContext *)in_stack_ffffffffffffff40,
                      (ExprList *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        substSelect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,iVar2);
      }
      local_58 = in_RSI;
      if (((ulong)in_RSI->db & 0x100000000000000) != 0) {
        pWVar7 = ((anon_union_8_3_c79b3df9_for_y *)&in_RSI->szOpAlloc)->pWin;
        pEVar5 = substExpr((SubstContext *)in_RSI,in_stack_ffffffffffffff90);
        pWVar7->pFilter = pEVar5;
        substExprList((SubstContext *)in_stack_ffffffffffffff40,
                      (ExprList *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        substExprList((SubstContext *)in_stack_ffffffffffffff40,
                      (ExprList *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_58 = in_RSI;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Expr *)local_58;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew->op==TK_TRUEFALSE ){
          pNew->u.iValue = sqlite3ExprTruthValue(pNew);
          pNew->op = TK_INTEGER;
          ExprSetProperty(pNew, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pNew);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pNew->op!=TK_COLUMN && pNew->op!=TK_COLLATE) ){
            pNew = sqlite3ExprAddCollateString(pSubst->pParse, pNew,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pNew, EP_Collate);
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}